

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_corr_to_refl_coef.c
# Opt level: O2

void WebRtcSpl_AutoCorrToReflCoef(int32_t *R,int use_order,int16_t *K)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  uint uVar16;
  ushort uVar17;
  int iVar18;
  short sVar19;
  int iVar20;
  bool bVar21;
  ushort local_98 [16];
  ushort auStack_78 [8];
  int16_t P [14];
  int16_t W [14];
  int16_t ACF [14];
  
  uVar2 = *R;
  bVar3 = 0;
  if (uVar2 != 0) {
    uVar16 = (int)uVar2 >> 0x1f ^ uVar2;
    bVar6 = (uVar16 < 0x8000) * '\x10';
    bVar3 = bVar6 + 8;
    if (0x7fffff < uVar16 << bVar6) {
      bVar3 = bVar6;
    }
    bVar6 = bVar3 + 4;
    if (0x7ffffff < uVar16 << (bVar3 & 0x1f)) {
      bVar6 = bVar3;
    }
    bVar3 = bVar6 + 2;
    if (0x1fffffff < uVar16 << (bVar6 & 0x1f)) {
      bVar3 = bVar6;
    }
    bVar3 = bVar3 + (uVar16 << (bVar3 & 0x1f) < 0x40000000);
  }
  iVar11 = 0;
  if (0 < use_order) {
    iVar11 = use_order;
  }
  local_98[0] = (ushort)((uVar2 << (bVar3 & 0x1f)) >> 0x10);
  for (lVar14 = 1; (int)lVar14 - iVar11 != 1; lVar14 = lVar14 + 1) {
    uVar15 = (ushort)((uint)(R[lVar14] << (bVar3 & 0x1f)) >> 0x10);
    P[lVar14 + 8] = uVar15;
    auStack_78[lVar14] = uVar15;
    local_98[lVar14] = uVar15;
  }
  iVar13 = 1;
  iVar10 = 0;
  iVar7 = 0;
  iVar12 = use_order;
  while( true ) {
    iVar12 = iVar12 + -1;
    iVar20 = 0;
    if (0 < iVar12) {
      iVar20 = iVar12;
    }
    if (iVar13 == iVar11 + 1) {
      return;
    }
    uVar15 = -local_98[1];
    if (0 < (short)local_98[1]) {
      uVar15 = local_98[1];
    }
    iVar18 = (int)(short)local_98[0];
    if ((short)local_98[0] < (short)uVar15) break;
    *K = 0;
    if (local_98[1] == 0) {
      sVar19 = 0;
    }
    else {
      iVar8 = (int)(short)uVar15;
      sVar19 = 0;
      for (iVar9 = -0xf; iVar9 != 0; iVar9 = iVar9 + 1) {
        iVar8 = iVar8 * 2;
        sVar19 = (ushort)(iVar18 <= iVar8) + sVar19 * 2;
        iVar5 = 0;
        if (iVar18 <= iVar8) {
          iVar5 = iVar18;
        }
        iVar8 = iVar8 - iVar5;
      }
      *K = sVar19;
      if (0 < (short)local_98[1]) {
        sVar19 = -sVar19;
        *K = sVar19;
      }
    }
    if (iVar13 == use_order) {
      return;
    }
    iVar18 = (int)sVar19;
    sVar19 = (short)((short)local_98[1] * iVar18 + 0x4000U >> 0xf);
    sVar4 = local_98[0] + sVar19;
    bVar21 = SCARRY2(local_98[0],sVar19);
    local_98[0] = local_98[0] + sVar19;
    if (bVar21) {
      local_98[0] = sVar4 >> 0xf ^ 0x8000;
    }
    for (lVar14 = 0; iVar20 != (int)lVar14; lVar14 = lVar14 + 1) {
      uVar15 = auStack_78[lVar14 + 1];
      uVar1 = local_98[lVar14 + 2];
      sVar19 = (short)((short)uVar1 * iVar18 + 0x4000U >> 0xf);
      uVar17 = sVar19 + uVar15;
      if (SCARRY2(sVar19,uVar15)) {
        uVar17 = (short)(uVar15 + sVar19) >> 0xf ^ 0x8000;
      }
      sVar19 = (short)((short)uVar15 * iVar18 + 0x4000U >> 0xf);
      uVar15 = uVar1 + sVar19;
      if (SCARRY2(uVar1,sVar19)) {
        uVar15 = (short)(sVar19 + uVar1) >> 0xf ^ 0x8000;
      }
      local_98[lVar14 + 1] = uVar15;
      auStack_78[lVar14 + 1] = uVar17;
    }
    iVar13 = iVar13 + 1;
    K = K + 1;
    iVar7 = iVar7 + 1;
    iVar10 = iVar10 + -1;
  }
  if (iVar7 < use_order) {
    iVar7 = use_order;
  }
  for (lVar14 = 0; iVar7 + iVar10 != (int)lVar14; lVar14 = lVar14 + 1) {
    K[lVar14] = 0;
  }
  return;
}

Assistant:

void WebRtcSpl_AutoCorrToReflCoef(const int32_t *R, int use_order, int16_t *K)
{
    int i, n;
    int16_t tmp;
    const int32_t *rptr;
    int32_t L_num, L_den;
    int16_t *acfptr, *pptr, *wptr, *p1ptr, *w1ptr, ACF[WEBRTC_SPL_MAX_LPC_ORDER],
            P[WEBRTC_SPL_MAX_LPC_ORDER], W[WEBRTC_SPL_MAX_LPC_ORDER];

    // Initialize loop and pointers.
    acfptr = ACF;
    rptr = R;
    pptr = P;
    p1ptr = &P[1];
    w1ptr = &W[1];
    wptr = w1ptr;

    // First loop; n=0. Determine shifting.
    tmp = WebRtcSpl_NormW32(*R);
    *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
    *pptr++ = *acfptr++;

    // Initialize ACF, P and W.
    for (i = 1; i <= use_order; i++)
    {
        *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
        *wptr++ = *acfptr;
        *pptr++ = *acfptr++;
    }

    // Compute reflection coefficients.
    for (n = 1; n <= use_order; n++, K++)
    {
        tmp = WEBRTC_SPL_ABS_W16(*p1ptr);
        if (*P < tmp)
        {
            for (i = n; i <= use_order; i++)
                *K++ = 0;

            return;
        }

        // Division: WebRtcSpl_div(tmp, *P)
        *K = 0;
        if (tmp != 0)
        {
            L_num = tmp;
            L_den = *P;
            i = 15;
            while (i--)
            {
                (*K) <<= 1;
                L_num <<= 1;
                if (L_num >= L_den)
                {
                    L_num -= L_den;
                    (*K)++;
                }
            }
            if (*p1ptr > 0)
                *K = -*K;
        }

        // Last iteration; don't do Schur recursion.
        if (n == use_order)
            return;

        // Schur recursion.
        pptr = P;
        wptr = w1ptr;
        tmp = (int16_t)(((int32_t)*p1ptr * (int32_t)*K + 16384) >> 15);
        *pptr = WebRtcSpl_AddSatW16(*pptr, tmp);
        pptr++;
        for (i = 1; i <= use_order - n; i++)
        {
            tmp = (int16_t)(((int32_t)*wptr * (int32_t)*K + 16384) >> 15);
            *pptr = WebRtcSpl_AddSatW16(*(pptr + 1), tmp);
            pptr++;
            tmp = (int16_t)(((int32_t)*pptr * (int32_t)*K + 16384) >> 15);
            *wptr = WebRtcSpl_AddSatW16(*wptr, tmp);
            wptr++;
        }
    }
}